

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodeList.c
# Opt level: O1

unsigned_long ixmlNodeList_length(IXML_NodeList *nList)

{
  unsigned_long uVar1;
  
  uVar1 = 0;
  for (; nList != (IXML_NodeList *)0x0; nList = nList->next) {
    uVar1 = uVar1 + 1;
  }
  return uVar1;
}

Assistant:

unsigned long ixmlNodeList_length(IXML_NodeList *nList)
{
	IXML_NodeList *list;
	unsigned long length = 0lu;

	list = nList;
	while (list != NULL) {
		++length;
		list = list->next;
	}

	return length;
}